

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int gost_cipher_init_param(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc,int paramNID,int mode)

{
  int iVar1;
  void *pvVar2;
  void *__src;
  void *in_RDX;
  long in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  ossl_gost_cipher_ctx *c;
  byte *in_stack_ffffffffffffff98;
  gost_ctx *in_stack_ffffffffffffffa0;
  ossl_gost_cipher_ctx *in_stack_ffffffffffffffa8;
  
  EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  pvVar2 = EVP_CIPHER_CTX_get_app_data(in_RDI);
  if (pvVar2 == (void *)0x0) {
    iVar1 = gost_cipher_set_param
                      (in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    if (iVar1 == 0) {
      return 0;
    }
    pvVar2 = (void *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    EVP_CIPHER_CTX_set_app_data(in_RDI,pvVar2);
  }
  if (in_RSI != 0) {
    gost_key(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  if (in_RDX != (void *)0x0) {
    pvVar2 = (void *)EVP_CIPHER_CTX_original_iv(in_RDI);
    iVar1 = EVP_CIPHER_CTX_get_iv_length(in_RDI);
    memcpy(pvVar2,in_RDX,(long)iVar1);
  }
  pvVar2 = (void *)EVP_CIPHER_CTX_iv_noconst(in_RDI);
  __src = (void *)EVP_CIPHER_CTX_original_iv(in_RDI);
  iVar1 = EVP_CIPHER_CTX_get_iv_length(in_RDI);
  memcpy(pvVar2,__src,(long)iVar1);
  return 1;
}

Assistant:

static int gost_cipher_init_param(EVP_CIPHER_CTX *ctx,
                                  const unsigned char *key,
                                  const unsigned char *iv, int enc,
                                  int paramNID, int mode)
{
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    if (EVP_CIPHER_CTX_get_app_data(ctx) == NULL) {
        if (!gost_cipher_set_param(c, paramNID))
            return 0;
        EVP_CIPHER_CTX_set_app_data(ctx, EVP_CIPHER_CTX_get_cipher_data(ctx));
    }
    if (key)
        gost_key(&(c->cctx), key);
    if (iv) {
        memcpy((unsigned char *)EVP_CIPHER_CTX_original_iv(ctx), iv,
               EVP_CIPHER_CTX_iv_length(ctx));
    }
    memcpy(EVP_CIPHER_CTX_iv_noconst(ctx),
           EVP_CIPHER_CTX_original_iv(ctx), EVP_CIPHER_CTX_iv_length(ctx));
    return 1;
}